

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O1

void test_29(QPDF *pdf,char *arg2)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  QPDFWriter w;
  QPDFObjectHandle root1;
  shared_ptr<QPDF> other2;
  QPDFObjectHandle dict;
  QPDFObjectHandle root2;
  shared_ptr<QPDF> other;
  QPDFObjectHandle local_a8;
  long local_98 [3];
  string local_80 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  long *local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_68;
  long local_60 [2];
  element_type *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  QPDF *local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  if (arg2 != (char *)0x0) {
    QPDF::create();
    QPDF::processFile((char *)local_30,arg2);
    QPDFObjectHandle::newDictionary();
    local_a8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)local_98;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"/QTest","");
    QPDF::getTrailer();
    local_70 = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"/QTest","");
    QPDFObjectHandle::getKey(local_80);
    QPDFObjectHandle::replaceKey((string *)&local_50,&local_a8);
    if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
    }
    if (local_70 != local_60) {
      operator_delete(local_70,local_60[0] + 1);
    }
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    }
    if (local_a8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)local_98) {
      operator_delete(local_a8.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                      local_98[0] + 1);
    }
    QPDF::getTrailer();
    local_a8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)local_98;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"/QTest","");
    QPDFObjectHandle::replaceKey((string *)&local_70,&local_a8);
    if (local_a8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)local_98) {
      operator_delete(local_a8.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                      local_98[0] + 1);
    }
    if (p_Stack_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_68);
    }
    QPDFWriter::QPDFWriter((QPDFWriter *)&local_a8,local_30,"a.pdf");
    QPDFWriter::write();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"oops -- didn\'t throw",0x14);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
    if (local_a8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_a8.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    QPDF::create();
    QPDF::emptyPDF();
    QPDFObjectHandle::newDictionary();
    p_Var1 = p_Stack_48;
    p_Stack_48 = local_a8.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    local_50 = local_a8.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_a8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
    local_a8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
    if (local_a8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_a8.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    local_a8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)local_98;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"/QTest","");
    QPDF::getRoot();
    QPDFObjectHandle::replaceKey((string *)&local_50,&local_a8);
    if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
    }
    if (local_a8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)local_98) {
      operator_delete(local_a8.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                      local_98[0] + 1);
    }
    QPDF::getTrailer();
    local_a8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)local_98;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"/QTest","");
    QPDFObjectHandle::replaceKey(local_80,&local_a8);
    if (local_a8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)local_98) {
      operator_delete(local_a8.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                      local_98[0] + 1);
    }
    if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
    }
    p_Var1 = p_Stack_68;
    local_70 = (long *)0x0;
    p_Stack_68 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
    QPDFWriter::QPDFWriter((QPDFWriter *)&local_a8,local_30,"a.pdf");
    QPDFWriter::write();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"oops -- didn\'t throw",0x14);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
    if (local_a8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_a8.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    QPDF::getRoot();
    QPDF::getRoot();
    local_a8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)local_98;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"/Oops","");
    QPDFObjectHandle::replaceKey(local_80,&local_a8);
    if (local_a8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)local_98) {
      operator_delete(local_a8.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                      local_98[0] + 1);
    }
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    }
    if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
    }
    if (p_Stack_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_68);
    }
    if (p_Stack_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_48);
    }
    if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
    }
    return;
  }
  __assert_fail("arg2 != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc",
                0x449,"void test_29(QPDF &, const char *)");
}

Assistant:

static void
test_29(QPDF& pdf, char const* arg2)
{
    // Detect mixed objects in QPDFWriter
    assert(arg2 != nullptr);
    auto other = QPDF::create();
    other->processFile(arg2);
    // We need to create a QPDF with mixed ownership to exercise
    // QPDFWriter's ownership check. To do this, we have to sneak the
    // foreign object inside an ownerless direct object to avoid
    // detection prior to calling QPDFWriter. Maybe a future version
    // of qpdf will be able prevent creating mixed ownership. Another
    // way to fake it out would be to call setDescription to
    // explicitly change the ownership to the wrong value.
    auto dict = QPDFObjectHandle::newDictionary();
    dict.replaceKey("/QTest", pdf.getTrailer().getKey("/QTest"));
    other->getTrailer().replaceKey("/QTest", dict);

    try {
        QPDFWriter w(*other, "a.pdf");
        w.write();
        std::cout << "oops -- didn't throw" << std::endl;
    } catch (std::logic_error const& e) {
        std::cout << "logic error: " << e.what() << std::endl;
    }

    // Make sure deleting the other source doesn't prevent detection.
    auto other2 = QPDF::create();
    other2->emptyPDF();
    dict = QPDFObjectHandle::newDictionary();
    dict.replaceKey("/QTest", other2->getRoot());
    other->getTrailer().replaceKey("/QTest", dict);
    other2 = nullptr;
    try {
        QPDFWriter w(*other, "a.pdf");
        w.write();
        std::cout << "oops -- didn't throw" << std::endl;
    } catch (std::logic_error const& e) {
        std::cout << "logic error: " << e.what() << std::endl;
    }

    // Detect adding a foreign object
    auto root1 = pdf.getRoot();
    auto root2 = other->getRoot();
    try {
        root1.replaceKey("/Oops", root2);
    } catch (std::logic_error const& e) {
        std::cout << "logic error: " << e.what() << std::endl;
    }
}